

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LipidTransVisitor.cpp
# Opt level: O2

void __thiscall OpenMD::LipidTransVisitor::update(LipidTransVisitor *this)

{
  bool bVar1;
  RotMat3x3d *this_00;
  Vector3d zaxis;
  MultipoleAdapter ma;
  Vector3d v1;
  Vector3d xaxis;
  Vector<double,_3U> local_98;
  Vector3d ref;
  Vector3d yaxis;
  
  StuntDouble::getPos((Vector3d *)&ref.super_Vector<double,_3U>,this->refSd_);
  StuntDouble::getPos((Vector3d *)&xaxis.super_Vector<double,_3U>,(StuntDouble *)this->originDatom_)
  ;
  Vector<double,_3U>::operator=
            (&(this->origin_).super_Vector<double,_3U>,&xaxis.super_Vector<double,_3U>);
  operator-(&xaxis.super_Vector<double,_3U>,&ref.super_Vector<double,_3U>,
            &(this->origin_).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&v1.super_Vector<double,_3U>,&xaxis.super_Vector<double,_3U>);
  Snapshot::wrapVector
            (this->info_->sman_->currentSnapshot_,(Vector3d *)&v1.super_Vector<double,_3U>);
  ma.at_ = (this->originDatom_->super_Atom).atomType_;
  Vector<double,_3U>::Vector(&zaxis.super_Vector<double,_3U>);
  bVar1 = MultipoleAdapter::isDipole(&ma);
  if (bVar1) {
    StuntDouble::getDipole
              ((Vector3d *)&xaxis.super_Vector<double,_3U>,(StuntDouble *)this->originDatom_);
    Vector<double,_3U>::operator=(&zaxis.super_Vector<double,_3U>,&xaxis.super_Vector<double,_3U>);
  }
  else {
    StuntDouble::getA((RotMat3x3d *)&yaxis,(StuntDouble *)this->originDatom_);
    SquareMatrix3<double>::transpose((SquareMatrix3<double> *)&xaxis,(RotMat3x3d *)&yaxis);
    operator*(&local_98,(RectMatrix<double,_3U,_3U> *)&xaxis,(Vector<double,_3U> *)OpenMD::V3Z);
    Vector3<double>::operator=(&zaxis,&local_98);
  }
  cross<double>((Vector3<double> *)&xaxis.super_Vector<double,_3U>,&v1,&zaxis);
  cross<double>((Vector3<double> *)&yaxis.super_Vector<double,_3U>,&zaxis,
                (Vector3<double> *)&xaxis.super_Vector<double,_3U>);
  Vector<double,_3U>::normalize(&xaxis.super_Vector<double,_3U>);
  Vector<double,_3U>::normalize(&yaxis.super_Vector<double,_3U>);
  Vector<double,_3U>::normalize(&zaxis.super_Vector<double,_3U>);
  this_00 = &this->rotMat_;
  RectMatrix<double,_3U,_3U>::setRow
            ((RectMatrix<double,_3U,_3U> *)this_00,0,&xaxis.super_Vector<double,_3U>);
  RectMatrix<double,_3U,_3U>::setRow
            ((RectMatrix<double,_3U,_3U> *)this_00,1,&yaxis.super_Vector<double,_3U>);
  RectMatrix<double,_3U,_3U>::setRow
            ((RectMatrix<double,_3U,_3U> *)this_00,2,&zaxis.super_Vector<double,_3U>);
  return;
}

Assistant:

void LipidTransVisitor::update() {
    Vector3d ref = refSd_->getPos();
    origin_      = originDatom_->getPos();
    Vector3d v1  = ref - origin_;
    info_->getSnapshotManager()->getCurrentSnapshot()->wrapVector(v1);

    MultipoleAdapter ma = MultipoleAdapter(originDatom_->getAtomType());
    Vector3d zaxis;
    if (ma.isDipole()) {
      zaxis = originDatom_->getDipole();
    } else {
      zaxis = originDatom_->getA().transpose() * V3Z;
    }

    Vector3d xaxis = cross(v1, zaxis);
    Vector3d yaxis = cross(zaxis, xaxis);

    xaxis.normalize();
    yaxis.normalize();
    zaxis.normalize();

    rotMat_.setRow(0, xaxis);
    rotMat_.setRow(1, yaxis);
    rotMat_.setRow(2, zaxis);
  }